

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmintcls.cpp
# Opt level: O0

int CVmObjClass::call_stat_prop(vm_val_t *result,uchar **pc_ptr,uint *argc,vm_prop_id_t prop)

{
  CVmMetaTable *pCVar1;
  int iVar2;
  vm_prop_id_t in_CX;
  uint *in_RDX;
  uchar **in_RSI;
  vm_val_t *in_RDI;
  undefined6 in_stack_ffffffffffffffd8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  pCVar1 = G_meta_table_X;
  CVmMetaclass::get_reg_idx(metaclass_reg_);
  iVar2 = CVmMetaTable::prop_to_vector_idx
                    ((CVmMetaTable *)CONCAT26(in_CX,in_stack_ffffffffffffffd8),
                     (uint)((ulong)pCVar1 >> 0x20),(vm_prop_id_t)((ulong)pCVar1 >> 0x10));
  if (iVar2 == 1) {
    iVar2 = s_getp_is_int_class((vm_val_t *)
                                CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                                &in_RDI->typ);
  }
  else {
    iVar2 = CVmObject::call_stat_prop(in_RDI,in_RSI,in_RDX,in_CX);
  }
  return iVar2;
}

Assistant:

int CVmObjClass::call_stat_prop(VMG_ vm_val_t *result, const uchar **pc_ptr,
                                uint *argc, vm_prop_id_t prop)
{
    /* translate the property into a function vector index */
    switch(G_meta_table
           ->prop_to_vector_idx(metaclass_reg_->get_reg_idx(), prop))
    {
    case 1:
        /* isIntrinsicClass(x) */
        return s_getp_is_int_class(vmg_ result, argc);

    default:
        /* 
         *   we don't define this one - inherit the default from the base
         *   object metaclass 
         */
        return CVmObject::call_stat_prop(vmg_ result, pc_ptr, argc, prop);
    }
}